

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

void __thiscall ot::commissioner::CommissionerApp::OnDatasetChanged(CommissionerApp *this)

{
  element_type *peVar1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  peVar1 = (this->mCommissioner).
           super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1330:9)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1330:9)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  (*peVar1->_vptr_Commissioner[0x19])(peVar1,&local_30,0xffff);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  peVar1 = (this->mCommissioner).
           super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1344:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app.cpp:1344:9)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  (*peVar1->_vptr_Commissioner[0x1f])(peVar1,&local_50,0xffff);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

void CommissionerApp::OnDatasetChanged()
{
    mCommissioner->GetActiveDataset(
        [this](const ActiveOperationalDataset *aDataset, Error aError) {
            if (aError == ErrorCode::kNone)
            {
                // FIXME(wgtdkp): synchronization
                mActiveDataset = *aDataset;
            }
            else
            {
                // TODO(wgtdkp): logging
            }
        },
        0xFFFF);

    mCommissioner->GetPendingDataset(
        [this](const PendingOperationalDataset *aDataset, Error aError) {
            if (aError == ErrorCode::kNone)
            {
                // FIXME(wgtdkp): synchronization
                mPendingDataset = *aDataset;
            }
            else
            {
                // TODO(wgtdkp): logging
            }
        },
        0xFFFF);
}